

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

Int32 testing::internal::Int32FromEnvOrDie(char *var,Int32 default_val)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  Int32 in_ESI;
  Int32 result;
  char *str_val;
  Int32 *in_stack_00000068;
  char *in_stack_00000070;
  Message *in_stack_00000078;
  char (*in_stack_ffffffffffffff98) [35];
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  Message *in_stack_ffffffffffffffd0;
  undefined4 local_24;
  undefined4 local_4;
  
  pcVar3 = posix::GetEnv((char *)0x9609c7);
  local_4 = in_ESI;
  if (pcVar3 != (char *)0x0) {
    Message::Message(in_stack_ffffffffffffffd0);
    Message::operator<<((Message *)
                        CONCAT17(in_stack_ffffffffffffffa7,
                                 CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                        in_stack_ffffffffffffff98);
    Message::operator<<((Message *)
                        CONCAT17(in_stack_ffffffffffffffa7,
                                 CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                        (char **)in_stack_ffffffffffffff98);
    bVar1 = ParseInt32(in_stack_00000078,in_stack_00000070,in_stack_00000068);
    bVar2 = bVar1 ^ 0xff;
    Message::~Message((Message *)0x960a4c);
    if ((bVar2 & 1) != 0) {
      exit(1);
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

Int32 Int32FromEnvOrDie(const char* var, Int32 default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == NULL) {
    return default_val;
  }

  Int32 result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}